

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::get_object_handle(void *ptr,type_info *type)

{
  pointer pptVar1;
  pointer pptVar2;
  internals *piVar3;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar5;
  iterator __begin3;
  values_and_holders local_78;
  void *local_68;
  iterator local_60;
  
  local_68 = ptr;
  piVar3 = get_internals();
  pVar5 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(piVar3->registered_instances)._M_h,&local_68);
  _Var4._M_cur = (__node_type *)
                 pVar5.first.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                 ._M_cur;
  do {
    if ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
        _Var4._M_cur ==
        pVar5.second.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
       ) {
      return (handle)(PyObject *)0x0;
    }
    local_78.inst =
         *(instance **)
          ((long)&((_Var4._M_cur)->
                  super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                  ._M_storage._M_storage + 8);
    local_78.tinfo = all_type_info(((local_78.inst)->ob_base).ob_type);
    values_and_holders::begin(&local_60,&local_78);
    pptVar1 = ((local_78.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pptVar2 = ((local_78.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (local_60.curr.index != (long)pptVar1 - (long)pptVar2 >> 3) {
      if (local_60.curr.type == type) {
        return (handle)*(PyObject **)
                        ((long)&((_Var4._M_cur)->
                                super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                                ._M_storage._M_storage + 8);
      }
      values_and_holders::iterator::operator++(&local_60);
    }
    _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline handle get_object_handle(const void *ptr, const detail::type_info *type ) {
    auto &instances = get_internals().registered_instances;
    auto range = instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        for (auto vh : values_and_holders(it->second)) {
            if (vh.type == type)
                return handle((PyObject *) it->second);
        }
    }
    return handle();
}